

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseExtraBuffers
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this)

{
  bool bVar1;
  pointer __b;
  unsigned_long *puVar2;
  StreamBlock *pSVar3;
  ulong local_30;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>
  local_20;
  ulong local_18;
  size_t lastIndex;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_local;
  
  if (this->RememberLength < this->Pos) {
    local_30 = this->Pos - this->RememberLength;
  }
  else {
    local_30 = 0;
  }
  local_18 = local_30;
  lastIndex = (size_t)this;
  bVar1 = std::
          map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
          ::empty(&this->Markers);
  if (!bVar1) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
         ::cbegin(&this->Markers);
    __b = std::
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>
          ::operator->(&local_20);
    puVar2 = std::min<unsigned_long>(&local_18,&__b->first);
    local_18 = *puVar2;
  }
  while( true ) {
    bVar1 = false;
    if (((this->pFirstBlock->Index < local_18) &&
        (bVar1 = false, this->pFirstBlock != this->pThisBlock)) &&
       (bVar1 = false, this->pFirstBlock->pNext != (StreamBlock *)0x0)) {
      bVar1 = this->pFirstBlock->pNext->Index <= local_18;
    }
    if (!bVar1) break;
    pSVar3 = std::
             exchange<SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*&>
                       (&this->pFirstBlock,&this->pFirstBlock->pNext);
    if (pSVar3 != (StreamBlock *)0x0) {
      operator_delete(pSVar3,0x1018);
    }
  }
  return;
}

Assistant:

void BacktrackingTokenStream<Token>::ReleaseExtraBuffers() noexcept {
    // Last valid index we have to keep track of
    // Specifically the smaller of:
    //   - the distance from RememberLength to Pos (or 0 if RememberLength > Pos);
    //   - if Markers has any keys, the first key in Markers.
    size_t lastIndex = Pos > RememberLength ? Pos - RememberLength : 0u;

    // Account for earliest marker
    if (!Markers.empty())
        lastIndex = std::min(lastIndex, Markers.cbegin()->first);

    // Free all blocks before lastIndex
    while (pFirstBlock->Index < lastIndex && pFirstBlock != pThisBlock &&
           pFirstBlock->pNext && pFirstBlock->pNext->Index <= lastIndex)
        delete std::exchange(pFirstBlock, pFirstBlock->pNext);
}